

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

HRESULT GenerateByteCode(ParseNodeProg *pnode,uint32 grfscr,ScriptContext *scriptContext,
                        ParseableFunctionInfo **ppRootFunc,uint sourceIndex,bool forceNoNative,
                        Parser *parser,CompileScriptException *pse,ScopeInfo *parentScopeInfo,
                        ScriptFunction **functionRef)

{
  undefined1 local_220 [8];
  ByteCodeGenerator byteCodeGenerator;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  ByteCodeGenerator::ByteCodeGenerator((ByteCodeGenerator *)local_220,scriptContext,parentScopeInfo)
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)
             ((long)&byteCodeGenerator.tryScopeRecordsList.tail + 4),
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  ByteCodeGenerator::Generate
            (pnode,grfscr,(ByteCodeGenerator *)local_220,ppRootFunc,sourceIndex,forceNoNative,parser
             ,functionRef);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)
             ((long)&byteCodeGenerator.tryScopeRecordsList.tail + 4));
  Js::ByteCodeWriter::~ByteCodeWriter((ByteCodeWriter *)&byteCodeGenerator.parentScopeInfo);
  return 0;
}

Assistant:

HRESULT GenerateByteCode(__in ParseNodeProg *pnode, __in uint32 grfscr, __in Js::ScriptContext* scriptContext, __inout Js::ParseableFunctionInfo ** ppRootFunc,
                         __in uint sourceIndex, __in bool forceNoNative, __in Parser* parser, __in CompileScriptException *pse, Js::ScopeInfo* parentScopeInfo,
                        Js::ScriptFunction ** functionRef)
{
    HRESULT hr = S_OK;
    ByteCodeGenerator byteCodeGenerator(scriptContext, parentScopeInfo);
    BEGIN_TRANSLATE_EXCEPTION_TO_HRESULT_NESTED
    {
        // Main code.
        ByteCodeGenerator::Generate(pnode, grfscr, &byteCodeGenerator, ppRootFunc, sourceIndex, forceNoNative, parser, functionRef);
    }